

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

size_t __thiscall
httplib::detail::MultipartFormDataParser::buf_find(MultipartFormDataParser *this,string *s)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  pointer pcVar4;
  ulong uVar5;
  size_t pos;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = this->buf_spos_;
  uVar2 = this->buf_epos_;
  uVar6 = uVar2;
  if (uVar1 < uVar2) {
    pcVar3 = (s->_M_dataplus)._M_p;
    pcVar4 = (this->buf_)._M_dataplus._M_p;
    uVar5 = s->_M_string_length;
    uVar8 = uVar1;
    do {
      while (pcVar4[uVar8] == *pcVar3) {
        if (uVar2 - uVar8 <= uVar5 - 1) {
          uVar6 = uVar2;
          if (uVar5 <= uVar2 - uVar8) {
            uVar6 = uVar8;
          }
          goto LAB_00174269;
        }
        uVar7 = 0;
        while (pcVar4[uVar7 + uVar8] == pcVar3[uVar7]) {
          uVar7 = uVar7 + 1;
          uVar6 = uVar8;
          if (uVar5 == uVar7) goto LAB_00174269;
        }
        uVar8 = uVar8 + 1;
        uVar6 = uVar2;
        if (uVar2 <= uVar8) goto LAB_00174269;
      }
      uVar8 = uVar8 + 1;
      uVar6 = uVar2;
    } while (uVar8 != uVar2);
  }
LAB_00174269:
  return uVar6 - uVar1;
}

Assistant:

size_t buf_find(const std::string &s) const {
    auto c = s.front();

    size_t off = buf_spos_;
    while (off < buf_epos_) {
      auto pos = off;
      while (true) {
        if (pos == buf_epos_) { return buf_size(); }
        if (buf_[pos] == c) { break; }
        pos++;
      }

      auto remaining_size = buf_epos_ - pos;
      if (s.size() > remaining_size) { return buf_size(); }

      if (start_with(buf_, pos, buf_epos_, s)) { return pos - buf_spos_; }

      off = pos + 1;
    }

    return buf_size();
  }